

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

bool chrono::utils::AddTriangleMeshGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  _func_int **pp_Var10;
  long lVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ChTriangleMeshShape *this;
  double *pdVar13;
  ChBody *model;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined1 local_158 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  shared_ptr<chrono::ChVisualMaterial> local_138;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_128;
  undefined1 local_118 [48];
  ChVisualModel *local_e8;
  ChSystem *local_e0;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_158,obj_filename,false,false);
  uVar9 = local_158._0_8_;
  if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
    if ((long)*(_func_int **)(local_158._0_8_ + 0x10) - (long)*(_func_int **)(local_158._0_8_ + 8)
        != 0) {
      lVar11 = ((long)*(_func_int **)(local_158._0_8_ + 0x10) -
                (long)*(_func_int **)(local_158._0_8_ + 8) >> 3) * -0x5555555555555555;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      pdVar13 = (double *)(*(_func_int **)(local_158._0_8_ + 8) + 0x10);
      auVar14 = ZEXT816(0xbff0000000000000);
      auVar15 = ZEXT816(0x4000000000000000);
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[1];
        dVar7 = dVar1 * dVar1;
        dVar3 = rot->m_data[2];
        dVar4 = rot->m_data[3];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar7 + dVar2 * dVar2;
        auVar20 = vfmadd213sd_fma(auVar20,auVar15,auVar14);
        dVar8 = dVar2 * dVar3 - dVar4 * dVar1;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pdVar13[-2];
        dVar5 = pdVar13[-1];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar5 * (dVar8 + dVar8);
        auVar20 = vfmadd231sd_fma(auVar25,auVar26,auVar20);
        dVar8 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *pdVar13;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar8 + dVar8;
        auVar20 = vfmadd213sd_fma(auVar21,auVar27,auVar20);
        dVar8 = dVar2 * dVar3 + dVar4 * dVar1;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar7 + dVar3 * dVar3;
        auVar21 = vfmadd213sd_fma(auVar23,auVar15,auVar14);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar8 + dVar8;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar5 * auVar21._0_8_;
        auVar21 = vfmadd231sd_fma(auVar24,auVar26,auVar16);
        dVar8 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar8 + dVar8;
        auVar21 = vfmadd213sd_fma(auVar17,auVar27,auVar21);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar1 = dVar1 * dVar2 + dVar4 * dVar3;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar8 + dVar8;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar5 * (dVar1 + dVar1);
        auVar17 = vfmadd231sd_fma(auVar22,auVar26,auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar4 * dVar4 + dVar7;
        auVar16 = vfmadd213sd_fma(auVar19,auVar15,auVar14);
        auVar16 = vfmadd213sd_fma(auVar16,auVar27,auVar17);
        dVar1 = pos->m_data[1];
        dVar2 = pos->m_data[2];
        pdVar13[-2] = auVar20._0_8_ + pos->m_data[0];
        pdVar13[-1] = auVar21._0_8_ + dVar1;
        *pdVar13 = auVar16._0_8_ + dVar2;
        pdVar13 = pdVar13 + 3;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    peVar6 = (body->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var12 = (body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    local_118._32_8_ =
         (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_118._40_8_ =
         (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_)->_M_use_count + 1;
      }
    }
    local_118._16_8_ = local_158._0_8_;
    local_118._24_8_ = local_158._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
      }
    }
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    local_b8.coord.pos.m_data[0] = 0.0;
    local_b8.coord.pos.m_data[1] = 0.0;
    local_b8.coord.pos.m_data[2] = 0.0;
    local_b8.coord.rot.m_data[1] = 0.0;
    local_b8.coord.rot.m_data[2] = 0.0;
    local_b8.coord.rot.m_data[3] = 0.0;
    local_b8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
    local_b8.coord.rot.m_data[0] = 1.0;
    local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (*peVar6->_vptr_ChCollisionModel[0x10])
              (peVar6,local_118 + 0x20,local_118 + 0x10,0,0,&local_d8,&local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_);
    }
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
    }
    if (visualization) {
      model = body;
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      pp_Var10 = local_b8._vptr_ChFrame;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.coord.pos.m_data[0]);
      }
      if ((pointer)pp_Var10 == (pointer)0x0) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
        p_Var12->_M_use_count = 1;
        p_Var12->_M_weak_count = 1;
        p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
        local_118._0_8_ = p_Var12 + 1;
        p_Var12[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var12[1]._M_use_count = 0;
        p_Var12[1]._M_weak_count = 0;
        p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var12[2]._M_use_count = 0;
        p_Var12[2]._M_weak_count = 0;
        p_Var12[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var12[2]._M_use_count = 0;
        p_Var12[2]._M_weak_count = 0;
        p_Var12[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var12[3]._M_use_count = 0;
        p_Var12[3]._M_weak_count = 0;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var12->_M_use_count = 2;
        }
        model = (ChBody *)local_118;
        local_118._8_8_ = p_Var12;
        ChPhysicsItem::AddVisualModel
                  (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
      }
      this = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model)
      ;
      ChTriangleMeshShape::ChTriangleMeshShape(this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&local_160,this);
      local_128.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_158._0_8_;
      local_128.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh(this,&local_128,true);
      if (local_128.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)&this->name);
      local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)this,&local_138);
      if (local_138.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      local_140 = local_160._M_pi;
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_160._M_pi)->_M_use_count = (local_160._M_pi)->_M_use_count + 1;
        }
      }
      local_d8.m_data[0] = 1.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = 0.0;
      local_d8.m_data[3] = 0.0;
      local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
      local_b8.coord.pos.m_data[0] = 0.0;
      local_b8.coord.pos.m_data[1] = 0.0;
      local_b8.coord.pos.m_data[2] = 0.0;
      local_b8.coord.rot.m_data[0] = 1.0;
      local_b8.coord.rot.m_data[1] = 0.0;
      local_b8.coord.rot.m_data[2] = 0.0;
      local_b8.coord.rot.m_data[3] = 0.0;
      local_158._16_8_ = this;
      ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,&local_d8);
      ChVisualModel::AddShape
                (local_e8,(shared_ptr<chrono::ChVisualShape> *)(local_158 + 0x10),&local_b8);
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
      }
      if (local_e0 != (ChSystem *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0);
      }
      if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  return (_func_int **)uVar9 != (_func_int **)0x0;
}

Assistant:

bool AddTriangleMeshGeometry(ChBody* body,
                             std::shared_ptr<ChMaterialSurface> material,
                             const std::string& obj_filename,
                             const std::string& name,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             bool visualization,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, false, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++)
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);

    body->GetCollisionModel()->AddTriangleMesh(material, trimesh, false, false);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}